

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_43(QPDF *pdf,char *arg2)

{
  QPDFFormFieldObjectHelper QVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  QPDFAnnotationObjectHelper *pQVar5;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annotations;
  QPDFFormFieldObjectHelper parent;
  QPDFFormFieldObjectHelper node;
  QPDFAcroFormDocumentHelper afdh;
  QPDFFormFieldObjectHelper *pQVar6;
  QPDFAnnotationObjectHelper *pQVar7;
  undefined8 in_stack_fffffffffffffde0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  QPDFFormFieldObjectHelper *pQVar8;
  QPDFPageObjectHelper *pQVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe08;
  undefined1 local_1d8 [8];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  string local_1a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  QPDFFormFieldObjectHelper *local_190;
  QPDFFormFieldObjectHelper *local_188;
  undefined1 local_170 [8];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_138;
  QPDFAcroFormDocumentHelper local_120;
  QPDFAnnotationObjectHelper *local_100;
  QPDFAnnotationObjectHelper *local_f8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e8;
  QPDFAnnotationObjectHelper local_d8;
  QPDFPageObjectHelper local_a0;
  QPDFFormFieldObjectHelper local_68;
  
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_120,pdf);
  cVar2 = QPDFAcroFormDocumentHelper::hasAcroForm();
  if (cVar2 == '\0') {
    std::operator<<((ostream *)&std::cout,"no forms\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"iterating over form fields\n");
    QPDFAcroFormDocumentHelper::getFormFields();
    pQVar8 = local_188;
    while (local_190 != pQVar8) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Field: ");
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1d8,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_190->field_0x8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_170);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_170);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
      QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                ((QPDFFormFieldObjectHelper *)local_170,local_190);
      pQVar6 = local_190;
      while( true ) {
        cVar2 = QPDFFormFieldObjectHelper::isNull();
        if (cVar2 != '\0') break;
        QPDFFormFieldObjectHelper::getParent();
        poVar4 = std::operator<<((ostream *)&std::cout,"  Parent: ");
        cVar2 = QPDFFormFieldObjectHelper::isNull();
        if (cVar2 == '\0') {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_e8,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
          QPDFObjectHandle::unparse_abi_cxx11_();
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffe00,"none",
                     (allocator<char> *)&stack0xfffffffffffffdf7);
        }
        poVar4 = std::operator<<(poVar4,(string *)&stack0xfffffffffffffe00);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
        if (cVar2 == '\0') {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
        }
        QPDFFormFieldObjectHelper::operator=
                  ((QPDFFormFieldObjectHelper *)local_170,(QPDFFormFieldObjectHelper *)local_1d8);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_1d8);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"  Fully qualified name: ");
      QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Partial name: ");
      QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Alternative name: ");
      QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Mapping name: ");
      QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Field type: ");
      QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Value: ");
      QPDFFormFieldObjectHelper::getValue();
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe08);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Value as string: ");
      QPDFFormFieldObjectHelper::getValueAsString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Default value: ");
      QPDFFormFieldObjectHelper::getDefaultValue();
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe08);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Default value as string: ");
      QPDFFormFieldObjectHelper::getDefaultValueAsString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Default appearance: ");
      QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_1d8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_1d8);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Quadding: ");
      iVar3 = QPDFFormFieldObjectHelper::getQuadding();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,pQVar6);
      QVar1._8_8_ = in_stack_fffffffffffffde0;
      QVar1._0_8_ = pQVar6;
      QVar1._16_8_ = in_stack_fffffffffffffde8._M_pi;
      QVar1._24_8_ = in_stack_fffffffffffffdf0;
      QVar1._32_8_ = pQVar8;
      QVar1.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)in_stack_fffffffffffffe00;
      QVar1.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = in_stack_fffffffffffffe08._M_pi;
      QPDFAcroFormDocumentHelper::getAnnotationsForField(QVar1);
      in_stack_fffffffffffffde8._M_pi = in_stack_fffffffffffffe08._M_pi;
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
      p_Var10 = in_stack_fffffffffffffe00;
      in_stack_fffffffffffffe08._M_pi = in_stack_fffffffffffffde8._M_pi;
      for (; in_stack_fffffffffffffe00 != in_stack_fffffffffffffde8._M_pi;
          in_stack_fffffffffffffe00 =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               &in_stack_fffffffffffffe00[3]._M_use_count) {
        poVar4 = std::operator<<((ostream *)&std::cout,"  Annotation: ");
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_138,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &in_stack_fffffffffffffe00->_M_use_count);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_1d8);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 &stack0xfffffffffffffe00);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_170);
      in_stack_fffffffffffffe00 = p_Var10;
      local_190 = pQVar6 + 1;
    }
    std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
              ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
               &local_190);
    std::operator<<((ostream *)&std::cout,"iterating over annotations per page\n");
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_170,pdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_170);
    while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_ptr !=
           local_138._M_refcount._M_pi) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Page: ");
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1d8,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &((QPDFPageObjectHelper *)local_138._M_ptr)->field_0x8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)local_170);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_170);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_a0,(QPDFPageObjectHelper *)local_138._M_ptr)
      ;
      QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage((QPDFPageObjectHelper *)&local_100);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_a0);
      pQVar7 = local_f8;
      pQVar9 = (QPDFPageObjectHelper *)local_138._M_ptr;
      for (pQVar5 = local_100; pQVar5 != pQVar7; pQVar5 = pQVar5 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"  Annotation: ");
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1d8,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pQVar5->field_0x8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_170);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_170);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
        poVar4 = std::operator<<((ostream *)&std::cout,"    Field: ");
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_d8,pQVar5);
        QPDFAcroFormDocumentHelper::getFieldForAnnotation((QPDFAnnotationObjectHelper *)local_170);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe00,
                   &local_168);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_1d8);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe08);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_170);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_d8);
        poVar4 = std::operator<<((ostream *)&std::cout,"    Subtype: ");
        QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_170);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_170);
        std::operator<<((ostream *)&std::cout,"    Rect: ");
        QPDFAnnotationObjectHelper::getRect();
        std::operator<<((ostream *)&std::cout,"[");
        poVar4 = std::ostream::_M_insert<double>((double)local_170);
        std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<double>((double)local_168._M_ptr);
        std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<double>((double)local_168._M_refcount._M_pi);
        std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<double>((double)local_158._M_pi);
        std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_();
        if (local_168._M_ptr != (element_type *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"    Appearance state: ");
          poVar4 = std::operator<<(poVar4,(string *)local_170);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"    Appearance stream (/N): ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffe00,"/N",
                   (allocator<char> *)&stack0xfffffffffffffde7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"",(allocator<char> *)&stack0xfffffffffffffde6);
        QPDFAnnotationObjectHelper::getAppearanceStream(local_1a0,(string *)pQVar5);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_1d8);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
        poVar4 = std::operator<<((ostream *)&std::cout,"    Appearance stream (/N, /3): ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffe00,"/N",
                   (allocator<char> *)&stack0xfffffffffffffde7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"/3",(allocator<char> *)&stack0xfffffffffffffde6);
        QPDFAnnotationObjectHelper::getAppearanceStream(local_1a0,(string *)pQVar5);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,(string *)local_1d8);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
        std::__cxx11::string::~string((string *)local_170);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 &local_100);
      local_138._M_ptr = (element_type *)(pQVar9 + 1);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_138);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_120);
  return;
}

Assistant:

static void
test_43(QPDF& pdf, char const* arg2)
{
    // Forms
    QPDFAcroFormDocumentHelper afdh(pdf);
    if (!afdh.hasAcroForm()) {
        std::cout << "no forms\n";
        return;
    }
    std::cout << "iterating over form fields\n";
    for (auto& ffh: afdh.getFormFields()) {
        std::cout << "Field: " << ffh.getObjectHandle().unparse() << std::endl;
        QPDFFormFieldObjectHelper node = ffh;
        while (!node.isNull()) {
            QPDFFormFieldObjectHelper parent(node.getParent());
            std::cout << "  Parent: "
                      << (parent.isNull() ? std::string("none")
                                          : parent.getObjectHandle().unparse())
                      << std::endl;
            node = parent;
        }
        std::cout << "  Fully qualified name: " << ffh.getFullyQualifiedName() << std::endl;
        std::cout << "  Partial name: " << ffh.getPartialName() << std::endl;
        std::cout << "  Alternative name: " << ffh.getAlternativeName() << std::endl;
        std::cout << "  Mapping name: " << ffh.getMappingName() << std::endl;
        std::cout << "  Field type: " << ffh.getFieldType() << std::endl;
        std::cout << "  Value: " << ffh.getValue().unparse() << std::endl;
        std::cout << "  Value as string: " << ffh.getValueAsString() << std::endl;
        std::cout << "  Default value: " << ffh.getDefaultValue().unparse() << std::endl;
        std::cout << "  Default value as string: " << ffh.getDefaultValueAsString() << std::endl;
        std::cout << "  Default appearance: " << ffh.getDefaultAppearance() << std::endl;
        std::cout << "  Quadding: " << ffh.getQuadding() << std::endl;
        std::vector<QPDFAnnotationObjectHelper> annotations = afdh.getAnnotationsForField(ffh);
        for (auto& aoh: annotations) {
            std::cout << "  Annotation: " << aoh.getObjectHandle().unparse() << std::endl;
        }
    }
    std::cout << "iterating over annotations per page\n";
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "Page: " << page.getObjectHandle().unparse() << std::endl;
        for (auto& ah: afdh.getWidgetAnnotationsForPage(page)) {
            std::cout << "  Annotation: " << ah.getObjectHandle().unparse() << std::endl;
            std::cout << "    Field: "
                      << (afdh.getFieldForAnnotation(ah).getObjectHandle().unparse()) << std::endl;
            std::cout << "    Subtype: " << ah.getSubtype() << std::endl;
            std::cout << "    Rect: ";
            print_rect(std::cout, ah.getRect());
            std::cout << std::endl;
            std::string state = ah.getAppearanceState();
            if (!state.empty()) {
                std::cout << "    Appearance state: " << state << std::endl;
            }
            std::cout << "    Appearance stream (/N): " << ah.getAppearanceStream("/N").unparse()
                      << std::endl;
            std::cout << "    Appearance stream (/N, /3): "
                      << ah.getAppearanceStream("/N", "/3").unparse() << std::endl;
        }
    }
}